

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzp_compress.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  pointer pbVar5;
  int iVar6;
  bool bVar7;
  undefined1 local_a0 [8];
  Mzp mzp;
  undefined1 local_58 [8];
  string mzp_out;
  
  mzp_out.field_2._8_8_ = argv;
  if (argc < 3) {
    main_cold_1();
    iVar6 = -1;
  }
  else {
    mzp.entry_data.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    mzp.entry_data.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    mzp.entry_headers.
    super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    mzp.entry_headers.
    super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    mzp.header.magic[0] = '\0';
    mzp.header.magic[1] = '\0';
    mzp.header.magic[2] = '\0';
    mzp.header.magic[3] = '\0';
    mzp.header.magic[4] = '\0';
    mzp.header.magic[5] = '\0';
    mzp.header.archive_entry_count = 0;
    mzp.entry_headers.
    super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    mzp.entry_data.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(ulong)(uint)argc;
    lVar3 = 2 - (long)mzp.entry_data.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
    bVar7 = true;
    pbVar5 = (pointer)0x3;
    iVar4 = 0;
    do {
      local_58 = (undefined1  [8])&mzp_out._M_string_length;
      mzp_out._M_dataplus._M_p = (pointer)0x0;
      mzp_out._M_string_length._0_1_ = 0;
      bVar1 = mg::fs::read_file(*(char **)(mzp_out.field_2._8_8_ + -8 + (long)pbVar5 * 8),
                                (string *)local_58);
      iVar6 = -1;
      if (bVar1) {
        fprintf(_stderr,"Adding file %s\n",
                *(undefined8 *)(mzp_out.field_2._8_8_ + -8 + (long)pbVar5 * 8));
        if (mzp.entry_headers.
            super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            mzp.entry_headers.
            super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::
          vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>::
          _M_realloc_insert<>((vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                               *)&mzp,(iterator)
                                      mzp.entry_headers.
                                      super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
        }
        else {
          (mzp.entry_headers.
           super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
           ._M_impl.super__Vector_impl_data._M_start)->sector_offset = 0;
          (mzp.entry_headers.
           super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
           ._M_impl.super__Vector_impl_data._M_start)->byte_offset = 0;
          (mzp.entry_headers.
           super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
           ._M_impl.super__Vector_impl_data._M_start)->size_sectors = 0;
          (mzp.entry_headers.
           super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
           ._M_impl.super__Vector_impl_data._M_start)->size_bytes = 0;
          mzp.entry_headers.
          super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
          ._M_impl.super__Vector_impl_data._M_start =
               mzp.entry_headers.
               super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
               ._M_impl.super__Vector_impl_data._M_start + 1;
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mzp.entry_headers.
                    super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
        iVar6 = iVar4;
      }
      if (local_58 != (undefined1  [8])&mzp_out._M_string_length) {
        operator_delete((void *)local_58,
                        CONCAT71(mzp_out._M_string_length._1_7_,(undefined1)mzp_out._M_string_length
                                ) + 1);
      }
      if (!bVar1) break;
      bVar7 = pbVar5 < mzp.entry_data.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
      lVar2 = lVar3 + (long)pbVar5;
      pbVar5 = (pointer)((long)&(pbVar5->_M_dataplus)._M_p + 1);
      iVar4 = iVar6;
    } while (lVar2 != 2);
    if (!bVar7) {
      local_58 = (undefined1  [8])&mzp_out._M_string_length;
      mzp_out._M_dataplus._M_p = (pointer)0x0;
      mzp_out._M_string_length._0_1_ = 0;
      mg::data::mzp_write((Mzp *)local_a0,(string *)local_58);
      bVar7 = mg::fs::write_file(*(char **)(mzp_out.field_2._8_8_ + 8),(string *)local_58);
      iVar6 = -1;
      if (bVar7) {
        iVar6 = 0;
        fprintf(_stderr,"Wrote %ld bytes to %s\n",mzp_out._M_dataplus._M_p,
                *(undefined8 *)(mzp_out.field_2._8_8_ + 8));
      }
      if (local_58 != (undefined1  [8])&mzp_out._M_string_length) {
        operator_delete((void *)local_58,
                        CONCAT71(mzp_out._M_string_length._1_7_,(undefined1)mzp_out._M_string_length
                                ) + 1);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&mzp.entry_headers.
                  super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (mzp.header != (MzpArchiveHeader)0x0) {
      operator_delete((void *)mzp.header,
                      (long)mzp.entry_headers.
                            super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)mzp.header);
    }
  }
  return iVar6;
}

Assistant:

int main(int argc, char **argv) {
  if (argc < 3) {
    fprintf(stderr, "%s output input [input..]\n", argv[0]);
    return -1;
  }

  // Constrct new MZP
  mg::data::Mzp mzp;

  // Read each input file as a new MZP record
  for (int i = 2; i < argc; i++) {
    std::string entry_data;
    if (!mg::fs::read_file(argv[i], entry_data)) {
      return -1;
    }

    fprintf(stderr, "Adding file %s\n", argv[i]);
    mzp.entry_headers.emplace_back();
    mzp.entry_data.emplace_back(entry_data);
  }

  // Write out the archive
  std::string mzp_out;
  mg::data::mzp_write(mzp, mzp_out);
  if (!mg::fs::write_file(argv[1], mzp_out)) {
    return -1;
  }
  fprintf(stderr, "Wrote %ld bytes to %s\n", mzp_out.size(), argv[1]);

  return 0;
}